

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::splitsegment
          (tetgenmesh *this,face *splitseg,point encpt,double rrp,point encpt1,point encpt2,
          int qflag,int chkencflag)

{
  uint *puVar1;
  double dVar2;
  memorypool *pmVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  shellface ppdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  face searchsh;
  triface searchtet;
  insertvertexflags ivf;
  point newpt;
  flipconstraints fc;
  face local_148;
  triface local_138;
  insertvertexflags local_128;
  point local_b0;
  flipconstraints local_a8;
  
  if ((qflag == 0) && ((*(byte *)((long)splitseg->sh + (long)this->shmarkindex * 4 + 4) & 8) != 0))
  {
    return 0;
  }
  if (this->b->nobisect != 0) {
    if (this->checkconstraints == 0) {
      return 0;
    }
    lVar6 = (long)this->areaboundindex;
    ppdVar7 = splitseg->sh[lVar6];
    if (((double)ppdVar7 == 0.0) && (!NAN((double)ppdVar7))) {
      ppdVar7 = splitseg->sh[splitseg->shver >> 1];
      uVar11 = (ulong)ppdVar7 & 0xfffffffffffffff8;
      uVar9 = uVar11;
      if (uVar11 == 0) {
        return 0;
      }
      while ((dVar2 = *(double *)(uVar9 + lVar6 * 8), dVar2 != 0.0 || (NAN(dVar2)))) {
        ppdVar7 = *(shellface *)(uVar9 + (ulong)((uint)ppdVar7 & 6) * 4);
        uVar9 = (ulong)ppdVar7 & 0xfffffffffffffff8;
        if ((uVar9 == uVar11) || (uVar9 == 0)) break;
      }
      if (uVar9 == 0) {
        return 0;
      }
      dVar2 = *(double *)(uVar9 + lVar6 * 8);
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return 0;
      }
    }
  }
  local_138.tet = (tetrahedron *)0x0;
  local_138.ver = 0;
  local_148.sh = (shellface *)0x0;
  local_148.shver = 0;
  local_128.refinetet.tet = (tetrahedron *)0x0;
  local_128.refinetet.ver = 0;
  local_128.refinesh.sh = (shellface *)0x0;
  local_128.refinesh.shver = 0;
  local_128.smlenflag = 0;
  local_128.smlen = 0.0;
  local_128.iloc = 0;
  local_128.bowywat = 0;
  local_128.lawson = 0;
  local_128.splitbdflag = 0;
  local_128.validflag = 0;
  local_128.respectbdflag = 0;
  local_128.rejflag = 0;
  local_128.chkencflag = 0;
  local_128.cdtflag = 0;
  local_128.assignmeshsize = 0;
  local_128.sloc = 0;
  local_128.sbowywat = 0;
  local_128.refineflag = 0;
  makepoint(this,&local_b0,FREESEGVERTEX);
  getsteinerptonsegment(this,splitseg,encpt,local_b0);
  if ((qflag == 0) && (this->b->cdtrefine == 0)) {
    ppdVar7 = splitseg->sh[splitseg->shver >> 1];
    uVar11 = (ulong)ppdVar7 & 0xfffffffffffffff8;
    uVar9 = uVar11;
    if (uVar11 != 0) {
      do {
        uVar12 = (ulong)((uint)ppdVar7 & 7);
        iVar4 = 1;
        do {
          uVar8 = uVar12;
          if (iVar4 != 1) {
            uVar8 = (ulong)snextpivot[uVar12];
          }
          uVar8 = *(ulong *)(uVar9 + 0x30 + (long)(snextpivot[uVar8] >> 1) * 8);
          if ((uVar8 != 0) &&
             (uVar10 = (ulong)(((uint)uVar8 & 7) << 2),
             iVar5 = checkseg4encroach(this,*(point *)((uVar8 & 0xfffffffffffffff8) +
                                                      (long)*(int *)((long)sorgpivot + uVar10) * 8),
                                       *(point *)((uVar8 & 0xfffffffffffffff8) +
                                                 (long)*(int *)((long)sdestpivot + uVar10) * 8),
                                       local_b0), iVar5 != 0)) {
            *(uint *)((long)local_b0 + (long)this->pointmarkindex * 4 + 4) =
                 *(byte *)((long)local_b0 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
            pmVar3 = this->points;
            *local_b0 = (double)pmVar3->deaditemstack;
            pmVar3->deaditemstack = local_b0;
            pmVar3->items = pmVar3->items + -1;
            return 0;
          }
          iVar4 = iVar4 + -1;
        } while (iVar4 == 0);
        ppdVar7 = *(shellface *)(uVar9 + (ulong)((uint)ppdVar7 & 6) * 4);
        uVar9 = (ulong)ppdVar7 & 0xfffffffffffffff8;
      } while ((uVar9 != 0) && (uVar9 != uVar11));
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  local_138.ver = (uint)splitseg->sh[9] & 0xf;
  local_138.tet = (tetrahedron *)((ulong)splitseg->sh[9] & 0xfffffffffffffff0);
  local_128.iloc = 4;
  local_128.bowywat = 3;
  iVar4 = this->b->metric;
  local_128.rejflag = (uint)(iVar4 != 0) << 2;
  local_128.chkencflag = chkencflag;
  local_128.sloc = 0xb;
  local_128.sbowywat = 3;
  local_128.lawson = 2;
  local_128.splitbdflag = 1;
  local_128.validflag = 1;
  local_128.respectbdflag = 1;
  local_128.assignmeshsize = iVar4;
  local_128.smlenflag = this->useinsertradius;
  iVar4 = insertpoint(this,local_b0,&local_138,&local_148,splitseg,&local_128);
  if (iVar4 == 0) {
    if (local_128.iloc != 9) {
      *(uint *)((long)local_b0 + (long)this->pointmarkindex * 4 + 4) =
           *(byte *)((long)local_b0 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
      pmVar3 = this->points;
      *local_b0 = (double)pmVar3->deaditemstack;
      pmVar3->deaditemstack = local_b0;
      pmVar3->items = pmVar3->items + -1;
      puVar1 = (uint *)((long)splitseg->sh + (long)this->shmarkindex * 4 + 4);
      *puVar1 = *puVar1 | 8;
      return 0;
    }
    puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
    puts("  the message above, your input data set, and the exact");
    puts("  command line you used to run this program, thank you.");
    exit(2);
  }
  this->st_segref_count = this->st_segref_count + 1;
  if (0 < this->steinerleft) {
    this->steinerleft = this->steinerleft + -1;
  }
  if (this->useinsertradius != 0) {
    save_segmentpoint_insradius(this,local_b0,local_128.parentpt,local_128.smlen);
  }
  if (this->flipstack != (badface *)0x0) {
    local_a8.seg[0] = (point)0x0;
    local_a8.fac[0] = (point)0x0;
    local_a8.remvert = (point)0x0;
    local_a8.unflip = 0;
    local_a8.collectnewtets = 0;
    local_a8.collectencsegflag = 0;
    local_a8.remove_ndelaunay_edge = 0;
    local_a8.bak_tetprism_vol._0_4_ = 0;
    local_a8.bak_tetprism_vol._4_4_ = 0;
    local_a8.tetprism_vol_sum._0_4_ = 0;
    local_a8._36_8_ = 0;
    local_a8.cosdihed_in = 0.0;
    local_a8.cosdihed_out = 0.0;
    local_a8.checkflipeligibility = 0;
    local_a8.chkencflag = chkencflag;
    local_a8.enqflag = 2;
    lawsonflip3d(this,&local_a8);
    this->unflipqueue->objects = 0;
    return 1;
  }
  return 1;
}

Assistant:

int tetgenmesh::splitsegment(face *splitseg, point encpt, REAL rrp, 
                             point encpt1, point encpt2, int qflag, 
                             int chkencflag)
{

  if (!qflag && smarktest3ed(*splitseg)) {
    // Do not try to re-split a marked segment.
    return 0;
  }

  if (b->nobisect) { // With -Y option.
    // Only split this segment if it is allowed to be split.
    if (checkconstraints) {
      // Check if it has a non-zero length bound. 
      if (areabound(*splitseg) == 0) {
        // It is not allowed.  However, if all of facets containing this seg
        //   is allowed to be split, we still split it.
        face parentsh, spinsh;
        //splitseg.shver = 0;
        spivot(*splitseg, parentsh);
        if (parentsh.sh == NULL) {
          return 0; // A dangling segment. Do not split it.
        }
        spinsh = parentsh;
        while (1) {
          if (areabound(spinsh) == 0) break;
          spivotself(spinsh);
          if (spinsh.sh == parentsh.sh) break;
		  if (spinsh.sh == NULL) break;  // It belongs to only one facet.
        }
        if ((!spinsh.sh) || (areabound(spinsh) == 0)) {
          // All facets at this seg are not allowed to be split.
          return 0;  // Do not split it.
        }
      }
    } else {
      return 0; // Do not split this segment.
    }
  } // if (b->nobisect)

  triface searchtet;
  face searchsh;
  point newpt;
  insertvertexflags ivf;

  makepoint(&newpt, FREESEGVERTEX);
  getsteinerptonsegment(splitseg, encpt, newpt);

  if (!qflag && !b->cdtrefine) {
    // Do not insert the point if it encroaches upon an adjacent segment.
    face parentsh;
    spivot(*splitseg, parentsh);
    if (parentsh.sh != NULL) {
      face spinsh, neighsh;
      face neighseg;
      spinsh = parentsh;
      while (1) {
        for (int i = 0; i < 2; i++) {
          if (i == 0) {
            senext(spinsh, neighsh);
          } else {
            senext2(spinsh, neighsh);
          }
          if (isshsubseg(neighsh)) {
            sspivot(neighsh, neighseg);
            if (checkseg4encroach(sorg(neighseg), sdest(neighseg), newpt)) {
              pointdealloc(newpt);
              return 0; // Do not split this segment.
            }
          }
        } // i
        spivotself(spinsh);
        if (spinsh.sh == NULL) break;
        if (spinsh.sh == parentsh.sh) break;
      } // while (1)
    }
  }

  // Split the segment by the Bowyer-Watson algorithm.
  sstpivot1(*splitseg, searchtet);
  ivf.iloc = (int) ONEDGE;
  ivf.bowywat = 3; // Use Bowyer-Watson, preserve subsegments and subfaces;
  ivf.validflag = 1; // Validate the B-W cavity.
  ivf.lawson = 2; // Do flips to recover Delaunayness.
  ivf.rejflag = 0;     // Do not check encroachment of new segments/facets.
  if (b->metric) {
    ivf.rejflag |= 4;  // Do check encroachment of protecting balls.
  }
  ivf.chkencflag = chkencflag;
  ivf.sloc = (int) INSTAR; // ivf.iloc;
  ivf.sbowywat = 3; // ivf.bowywat;  // Surface mesh options.
  ivf.splitbdflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.


  if (insertpoint(newpt, &searchtet, &searchsh, splitseg, &ivf)) {
    st_segref_count++;
    if (steinerleft > 0) steinerleft--;
    if (useinsertradius) {
      save_segmentpoint_insradius(newpt, ivf.parentpt, ivf.smlen);
    }
    if (flipstack != NULL) {
      flipconstraints fc;
      fc.chkencflag = chkencflag;
      fc.enqflag = 2;
      lawsonflip3d(&fc);
      unflipqueue->restart();
    }
    return 1;
  } else {
    // Point is not inserted.
    if (ivf.iloc == (int) NEARVERTEX) {
      terminatetetgen(this, 2);
    }
    pointdealloc(newpt);
    // Mark this segment to avoid splitting in the future.
	smarktest3(*splitseg);
    return 0;
  }
}